

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

BSDFSample * __thiscall
pbrt::ThinDielectricBxDF::Sample_f
          (ThinDielectricBxDF *this,Vector3f wo,Float uc,Point2f *u,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  undefined1 auVar1 [16];
  int iVar2;
  Float in_ESI;
  BSDFSample *in_RDI;
  BxDFReflTransFlags in_R8D;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [56];
  undefined1 auVar3 [64];
  float in_XMM2_Da;
  Vector3<float> VVar5;
  SampledSpectrum ft;
  Vector3f wi_1;
  SampledSpectrum fr;
  Vector3f wi;
  Float pt;
  Float pr;
  Float T;
  Float R;
  float in_stack_ffffffffffffff48;
  Float in_stack_ffffffffffffff4c;
  float c;
  BSDFSample *pBVar6;
  SampledSpectrum local_98;
  Tuple3<pbrt::Vector3,_float> local_88;
  Tuple3<pbrt::Vector3,_float> local_78;
  SampledSpectrum local_6c;
  Vector3f local_5c;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  BxDFReflTransFlags local_40;
  float local_2c;
  Tuple3<pbrt::Vector3,_float> local_1c;
  Tuple3<pbrt::Vector3,_float> local_c;
  
  local_1c._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  pBVar6 = in_RDI;
  local_40 = in_R8D;
  local_2c = in_XMM2_Da;
  local_c._0_8_ = local_1c._0_8_;
  CosTheta((Vector3f *)&local_c);
  local_44 = FrDielectric(in_ESI,(Float)((ulong)pBVar6 >> 0x20));
  local_48 = 1.0 - local_44;
  if (local_44 < 1.0) {
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_44),ZEXT416((uint)-local_44),
                             SUB6416(ZEXT464(0x3f800000),0));
    local_44 = (local_48 * local_48 * local_44) / auVar1._0_4_ + local_44;
    local_48 = 1.0 - local_44;
  }
  local_4c = local_44;
  local_50 = local_48;
  iVar2 = operator&(local_40,Reflection);
  if (iVar2 == 0) {
    local_4c = 0.0;
  }
  iVar2 = operator&(local_40,Transmission);
  if (iVar2 == 0) {
    local_50 = 0.0;
  }
  if ((((local_4c != 0.0) || (NAN(local_4c))) || (local_50 != 0.0)) || (NAN(local_50))) {
    auVar4 = ZEXT856(0);
    if (local_4c / (local_4c + local_50) <= local_2c) {
      VVar5 = Tuple3<pbrt::Vector3,_float>::operator-((Tuple3<pbrt::Vector3,_float> *)in_RDI);
      local_88.z = VVar5.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar3._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar3._8_56_ = auVar4;
      local_88._0_8_ = vmovlpd_avx(auVar3._0_16_);
      local_78._0_8_ = local_88._0_8_;
      local_78.z = local_88.z;
      AbsCosTheta((Vector3f *)0x7e7241);
      SampledSpectrum::SampledSpectrum(&in_RDI->f,in_stack_ffffffffffffff4c);
      BSDFSample::BSDFSample
                (in_RDI,&local_98,(Vector3f *)&local_78,local_50 / (local_4c + local_50),
                 SpecularTransmission);
    }
    else {
      Vector3<float>::Vector3
                ((Vector3<float> *)in_RDI,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,0.0);
      c = local_44;
      AbsCosTheta((Vector3f *)0x7e71b5);
      SampledSpectrum::SampledSpectrum(&in_RDI->f,c);
      BSDFSample::BSDFSample
                (in_RDI,&local_6c,&local_5c,local_4c / (local_4c + local_50),SpecularReflection);
    }
  }
  else {
    memset(in_RDI,0,0x24);
    BSDFSample::BSDFSample(in_RDI);
  }
  return pBVar6;
}

Assistant:

PBRT_CPU_GPU
    BSDFSample Sample_f(Vector3f wo, Float uc, const Point2f &u, TransportMode mode,
                        BxDFReflTransFlags sampleFlags) const {
        Float R = FrDielectric(CosTheta(wo), eta), T = 1 - R;
        // Compute _R_ and _T_ accounting for scattering between interfaces
        if (R < 1) {
            R += T * T * R / (1 - R * R);
            T = 1 - R;
        }

        // Compute probabilities _pr_ and _pt_ for sampling reflection and transmission
        Float pr = R, pt = T;
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        if (uc < pr / (pr + pt)) {
            // Sample perfect specular reflection at interface
            Vector3f wi(-wo.x, -wo.y, wo.z);
            SampledSpectrum fr(R / AbsCosTheta(wi));
            return BSDFSample(fr, wi, pr / (pr + pt), BxDFFlags::SpecularReflection);

        } else {
            // Sample perfect specular transmission at thin dielectric interface
            Vector3f wi = -wo;
            SampledSpectrum ft(T / AbsCosTheta(wi));
            return BSDFSample(ft, wi, pt / (pr + pt), BxDFFlags::SpecularTransmission);
        }
    }